

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  undefined8 *puVar2;
  RayQueryContext *k;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  vbool<4> vVar11;
  size_t sVar12;
  bool bVar13;
  undefined4 uVar14;
  AABBNodeMB4D *node1;
  undefined1 *puVar15;
  RayQueryContext *pRVar16;
  ulong uVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  uint uVar20;
  ulong uVar21;
  RayQueryContext *pRVar22;
  RayQueryContext *pRVar23;
  long lVar24;
  NodeRef root;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar25;
  NodeRef *pNVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  float fVar46;
  float fVar47;
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar48;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar55;
  float fVar56;
  vint4 bi_3;
  undefined1 auVar50 [16];
  float fVar57;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar54;
  float fVar58;
  float fVar59;
  float fVar61;
  float fVar63;
  float fVar64;
  float fVar66;
  vint4 ai_12;
  float fVar62;
  float fVar65;
  float fVar67;
  float fVar68;
  undefined1 auVar60 [16];
  float fVar69;
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vint4 ai_1;
  float fVar76;
  undefined1 auVar71 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  vint4 ai_3;
  float fVar82;
  float fVar83;
  vint4 bi;
  undefined1 auVar81 [16];
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  vint4 bi_1;
  undefined1 auVar86 [16];
  uint uVar89;
  uint uVar90;
  uint uVar91;
  vint4 ai_2;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  float fVar95;
  uint uVar96;
  vint4 bi_4;
  float fVar97;
  uint uVar98;
  uint uVar99;
  float fVar100;
  uint uVar103;
  float fVar104;
  uint uVar105;
  float fVar106;
  vfloat4 a0;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  vint4 ai_15;
  float fVar114;
  float fVar115;
  float fVar116;
  uint uVar117;
  float fVar120;
  uint uVar121;
  float fVar122;
  uint uVar123;
  vint4 bi_10;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  uint uVar124;
  vint4 ai_13;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar129;
  float fVar130;
  float fVar131;
  undefined8 local_1958;
  undefined8 uStack_1950;
  vbool<4> terminated;
  vbool<4> valid_o;
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar10 = mm_lookupmask_ps._8_8_;
  uVar9 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  sVar1 = (bvh->root).ptr;
  if (sVar1 != 8) {
    auVar81 = *(undefined1 (*) [16])(ray + 0x80);
    auVar71._0_12_ = ZEXT812(0);
    auVar71._12_4_ = 0;
    auVar50._0_4_ = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar81._0_4_);
    auVar50._4_4_ = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar81._4_4_);
    auVar50._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar81._8_4_);
    auVar50._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar81._12_4_);
    uVar20 = movmskps((int)context,auVar50);
    if (uVar20 != 0) {
      uVar21 = (ulong)(uVar20 & 0xff);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      fVar69 = tray.dir.field_0._0_4_;
      fVar72 = tray.dir.field_0._4_4_;
      fVar74 = tray.dir.field_0._8_4_;
      fVar76 = tray.dir.field_0._12_4_;
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      fVar58 = tray.dir.field_0._16_4_;
      fVar61 = tray.dir.field_0._20_4_;
      fVar64 = tray.dir.field_0._24_4_;
      fVar67 = tray.dir.field_0._28_4_;
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar49 = tray.dir.field_0._32_4_;
      fVar55 = tray.dir.field_0._36_4_;
      fVar56 = tray.dir.field_0._40_4_;
      fVar57 = tray.dir.field_0._44_4_;
      auVar86._0_4_ = fVar58 * fVar58 + fVar49 * fVar49;
      auVar86._4_4_ = fVar61 * fVar61 + fVar55 * fVar55;
      auVar86._8_4_ = fVar64 * fVar64 + fVar56 * fVar56;
      auVar86._12_4_ = fVar67 * fVar67 + fVar57 * fVar57;
      auVar101._0_4_ = fVar69 * fVar69 + auVar86._0_4_;
      auVar101._4_4_ = fVar72 * fVar72 + auVar86._4_4_;
      auVar101._8_4_ = fVar74 * fVar74 + auVar86._8_4_;
      auVar101._12_4_ = fVar76 * fVar76 + auVar86._12_4_;
      auVar86 = rsqrtps(auVar86,auVar101);
      fVar84 = auVar86._0_4_;
      fVar28 = auVar86._4_4_;
      fVar29 = auVar86._8_4_;
      fVar46 = auVar86._12_4_;
      pre.depth_scale.field_0.v[0] = fVar84 * fVar84 * auVar101._0_4_ * -0.5 * fVar84 + fVar84 * 1.5
      ;
      pre.depth_scale.field_0.v[1] = fVar28 * fVar28 * auVar101._4_4_ * -0.5 * fVar28 + fVar28 * 1.5
      ;
      pre.depth_scale.field_0.v[2] = fVar29 * fVar29 * auVar101._8_4_ * -0.5 * fVar29 + fVar29 * 1.5
      ;
      pre.depth_scale.field_0.v[3] =
           fVar46 * fVar46 * auVar101._12_4_ * -0.5 * fVar46 + fVar46 * 1.5;
      while (uVar21 != 0) {
        lVar24 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        auVar101 = insertps(ZEXT416(*(uint *)(ray + lVar24 * 4 + 0x40)),
                            *(undefined4 *)(ray + lVar24 * 4 + 0x50),0x1c);
        auVar101 = insertps(auVar101,*(undefined4 *)(ray + lVar24 * 4 + 0x60),0x28);
        fVar84 = *(float *)((long)pre.ray_space + lVar24 * 4 + -0x10);
        auVar102._0_4_ = auVar101._0_4_ * fVar84;
        auVar102._4_4_ = auVar101._4_4_ * fVar84;
        auVar102._8_4_ = auVar101._8_4_ * fVar84;
        auVar102._12_4_ = auVar101._12_4_ * fVar84;
        uVar17 = CONCAT44(auVar102._4_4_,auVar102._4_4_);
        auVar30._0_8_ = uVar17 ^ 0x8000000080000000;
        auVar30._8_4_ = -auVar102._12_4_;
        auVar30._12_4_ = -auVar102._12_4_;
        auVar101 = blendps(auVar30,auVar71,0xe);
        auVar127._4_4_ = auVar101._0_4_;
        auVar127._0_4_ = auVar102._8_4_;
        auVar127._8_4_ = auVar101._4_4_;
        auVar127._12_4_ = 0;
        auVar126._4_4_ = auVar101._0_4_;
        auVar126._0_4_ = auVar102._8_4_;
        auVar126._8_4_ = auVar101._4_4_;
        auVar126._12_4_ = 0;
        auVar126 = dpps(auVar126 << 0x20,auVar127 << 0x20,0x7f);
        uVar17 = CONCAT44(auVar102._12_4_,auVar102._8_4_);
        auVar118._0_8_ = uVar17 ^ 0x8000000080000000;
        auVar118._8_4_ = -auVar102._8_4_;
        auVar118._12_4_ = -auVar102._12_4_;
        auVar86 = insertps(auVar118,auVar102,0x2a);
        auVar101 = dpps(auVar86,auVar86,0x7f);
        iVar27 = -(uint)(auVar101._0_4_ < auVar126._0_4_);
        auVar31._4_4_ = iVar27;
        auVar31._0_4_ = iVar27;
        auVar31._8_4_ = iVar27;
        auVar31._12_4_ = iVar27;
        auVar101 = blendvps(auVar86,auVar127 << 0x20,auVar31);
        auVar86 = dpps(auVar101,auVar101,0x7f);
        auVar127 = rsqrtss(auVar86,auVar86);
        fVar28 = auVar127._0_4_;
        fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar86._0_4_ * 0.5 * fVar28;
        fVar29 = fVar28 * auVar101._0_4_;
        fVar46 = fVar28 * auVar101._4_4_;
        fVar47 = fVar28 * auVar101._8_4_;
        fVar28 = fVar28 * auVar101._12_4_;
        fVar116 = fVar46 * auVar102._0_4_ - auVar102._4_4_ * fVar29;
        fVar120 = fVar47 * auVar102._4_4_ - auVar102._8_4_ * fVar46;
        fVar122 = fVar29 * auVar102._8_4_ - auVar102._0_4_ * fVar47;
        auVar119._12_4_ = fVar28 * auVar102._12_4_ - auVar102._12_4_ * fVar28;
        auVar119._0_8_ = CONCAT44(fVar122,fVar120);
        auVar119._8_4_ = fVar116;
        auVar125._8_4_ = fVar116;
        auVar125._0_8_ = auVar119._0_8_;
        auVar125._12_4_ = auVar119._12_4_;
        auVar101 = dpps(auVar125,auVar119,0x7f);
        valid_i = (vint<4> *)(uVar21 - 1);
        uVar21 = uVar21 & (ulong)valid_i;
        auVar86 = rsqrtss(auVar101,auVar101);
        fVar28 = auVar86._0_4_;
        fVar28 = fVar28 * 1.5 - fVar28 * fVar28 * auVar101._0_4_ * 0.5 * fVar28;
        aVar32.m128[1] = fVar28 * fVar116;
        aVar32.m128[0] = fVar47;
        aVar32.m128[2] = auVar102._8_4_ * fVar84;
        aVar32.m128[3] = 0.0;
        pre.ray_space[lVar24].vx.field_0.m128[0] = fVar29;
        pre.ray_space[lVar24].vx.field_0.m128[1] = fVar28 * fVar120;
        pre.ray_space[lVar24].vx.field_0.m128[2] = auVar102._0_4_ * fVar84;
        pre.ray_space[lVar24].vx.field_0.m128[3] = 0.0;
        aVar7.m128[1] = fVar28 * fVar122;
        aVar7.m128[0] = fVar46;
        aVar7.m128[2] = auVar102._4_4_ * fVar84;
        aVar7.m128[3] = 0.0;
        pre.ray_space[lVar24].vy.field_0 = aVar7;
        pre.ray_space[lVar24].vz.field_0 = aVar32;
      }
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar33._4_4_ = -(uint)(ABS(fVar72) < 1e-18);
      auVar33._0_4_ = -(uint)(ABS(fVar69) < 1e-18);
      auVar33._8_4_ = -(uint)(ABS(fVar74) < 1e-18);
      auVar33._12_4_ = -(uint)(ABS(fVar76) < 1e-18);
      auVar86 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar101 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar34._4_4_ = -(uint)(ABS(fVar61) < 1e-18);
      auVar34._0_4_ = -(uint)(ABS(fVar58) < 1e-18);
      auVar71 = divps(_DAT_01f46a60,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar35._4_4_ = -(uint)(ABS(fVar55) < 1e-18);
      auVar35._0_4_ = -(uint)(ABS(fVar49) < 1e-18);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)blendvps(auVar86,_DAT_01f76a70,auVar33);
      auVar34._8_4_ = -(uint)(ABS(fVar64) < 1e-18);
      auVar34._12_4_ = -(uint)(ABS(fVar67) < 1e-18);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)blendvps(auVar101,_DAT_01f76a70,auVar34)
      ;
      auVar35._8_4_ = -(uint)(ABS(fVar56) < 1e-18);
      auVar35._12_4_ = -(uint)(ABS(fVar57) < 1e-18);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)blendvps(auVar71,_DAT_01f76a70,auVar35);
      tray.nearXYZ.field_0._0_4_ = -(uint)(tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)(tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)(tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)(tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar36._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._20_4_);
      auVar36._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._16_4_);
      auVar36._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._24_4_);
      auVar36._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar36);
      auVar37._4_4_ = -(uint)(0.0 <= tray.rdir.field_0._36_4_);
      auVar37._0_4_ = -(uint)(0.0 <= tray.rdir.field_0._32_4_);
      auVar37._8_4_ = -(uint)(0.0 <= tray.rdir.field_0._40_4_);
      auVar37._12_4_ = -(uint)(0.0 <= tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar37);
      auVar71 = maxps(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0));
      auVar81 = maxps(auVar81,ZEXT816(0));
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar71,auVar50);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar81,auVar50);
      auVar81._8_4_ = 0xffffffff;
      auVar81._0_8_ = 0xffffffffffffffff;
      auVar81._12_4_ = 0xffffffff;
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar81 ^ auVar50);
      if (context->user == (RTCRayQueryContext *)0x0) {
        pRVar23 = (RayQueryContext *)0x3;
        pRVar22 = (RayQueryContext *)0x0;
      }
      else {
        pRVar22 = (RayQueryContext *)
                  (CONCAT71((int7)((ulong)context->args >> 8),
                            *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01);
        pRVar23 = (RayQueryContext *)((ulong)((char)pRVar22 == '\0') + 2);
      }
      pNVar26 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar25 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_node[1].ptr = sVar1;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      puVar15 = mm_lookupmask_ps;
      aVar129 = _DAT_01f45a30;
LAB_006d498e:
      do {
        do {
          root.ptr = pNVar26[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006d51cd;
          pNVar26 = pNVar26 + -1;
          paVar25 = paVar25 + -1;
          aVar51.v = *(__m128 *)paVar25->v;
          auVar38._4_4_ = -(uint)(aVar51._4_4_ < tray.tfar.field_0.v[1]);
          auVar38._0_4_ = -(uint)(aVar51._0_4_ < tray.tfar.field_0.v[0]);
          auVar38._8_4_ = -(uint)(aVar51._8_4_ < tray.tfar.field_0.v[2]);
          auVar38._12_4_ = -(uint)(aVar51._12_4_ < tray.tfar.field_0.v[3]);
          uVar20 = movmskps((int)puVar15,auVar38);
          puVar15 = (undefined1 *)(ulong)uVar20;
        } while (uVar20 == 0);
        uVar21 = (ulong)(byte)uVar20;
        pRVar16 = (RayQueryContext *)(ulong)(uint)POPCOUNT(uVar20 & 0xff);
        puVar15 = (undefined1 *)pRVar16;
        if (pRVar23 < pRVar16) {
LAB_006d49d0:
          vVar11.field_0 = terminated.field_0;
          do {
            fVar49 = aVar51.v[0];
            fVar55 = aVar51.v[1];
            fVar56 = aVar51.v[2];
            fVar57 = aVar51.v[3];
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006d51cd;
              auVar44._4_4_ = -(uint)(fVar55 < tray.tfar.field_0.v[1]);
              auVar44._0_4_ = -(uint)(fVar49 < tray.tfar.field_0.v[0]);
              auVar44._8_4_ = -(uint)(fVar56 < tray.tfar.field_0.v[2]);
              auVar44._12_4_ = -(uint)(fVar57 < tray.tfar.field_0.v[3]);
              uVar20 = movmskps((int)puVar15,auVar44);
              puVar15 = (undefined1 *)(ulong)uVar20;
              if (uVar20 != 0) {
                pRVar22 = (RayQueryContext *)This->leafIntersector;
                valid_o.field_0._0_8_ = uVar9;
                valid_o.field_0._8_8_ = uVar10;
                uVar20 = movmskps((int)uVar21,(undefined1  [16])terminated.field_0);
                uVar21 = (ulong)(uVar20 ^ 0xf);
                puVar18 = (undefined8 *)
                          ((long)pRVar22 +
                          (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x18);
                puVar19 = puVar18;
                while (uVar21 != 0) {
                  puVar2 = (undefined8 *)0x0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> (long)puVar2 & 1) == 0;
                        puVar2 = (undefined8 *)((long)puVar2 + 1)) {
                    }
                  }
                  uVar21 = uVar21 & uVar21 - 1;
                  valid_i = (vint<4> *)&pre;
                  pRVar22 = context;
                  puVar19 = (undefined8 *)
                            (*(code *)*puVar18)(valid_i,ray,puVar2,context,
                                                (byte *)(root.ptr & 0xfffffffffffffff0));
                  aVar129 = _DAT_01f45a30;
                  if ((char)puVar19 != '\0') {
                    valid_o.field_0.i[(long)puVar2] = -1;
                    puVar19 = puVar2;
                  }
                }
                auVar8._8_8_ = valid_o.field_0._8_8_;
                auVar8._0_8_ = valid_o.field_0._0_8_;
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])vVar11.field_0 | auVar8);
                uVar20 = movmskps((int)puVar19,(undefined1  [16])terminated.field_0);
                puVar15 = (undefined1 *)(ulong)uVar20;
                if (uVar20 == 0xf) goto LAB_006d51cd;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                              (undefined1  [16])terminated.field_0);
              }
              goto LAB_006d498e;
            }
            uVar17 = root.ptr & 0xfffffffffffffff0;
            uVar20 = (uint)root.ptr & 7;
            pRVar22 = (RayQueryContext *)(ulong)uVar20;
            root.ptr = 8;
            aVar51 = aVar129;
            for (lVar24 = -0x10;
                (lVar24 != 0 && (sVar1 = *(size_t *)(uVar17 + 0x20 + lVar24 * 2), sVar1 != 8));
                lVar24 = lVar24 + 4) {
              if ((uVar20 == 6) || (uVar20 == 1)) {
                fVar58 = *(float *)(uVar17 + 0x90 + lVar24);
                fVar61 = *(float *)(uVar17 + 0x30 + lVar24);
                fVar64 = *(float *)(uVar17 + 0x40 + lVar24);
                fVar67 = *(float *)(uVar17 + 0x50 + lVar24);
                fVar69 = *(float *)(uVar17 + 0x60 + lVar24);
                auVar81 = *(undefined1 (*) [16])(ray + 0x70);
                fVar122 = auVar81._0_4_;
                fVar62 = auVar81._4_4_;
                fVar65 = auVar81._8_4_;
                fVar68 = auVar81._12_4_;
                fVar72 = *(float *)(uVar17 + 0xb0 + lVar24);
                fVar74 = *(float *)(uVar17 + 0xd0 + lVar24);
                fVar76 = *(float *)(uVar17 + 0x70 + lVar24);
                fVar84 = *(float *)(uVar17 + 0xa0 + lVar24);
                fVar28 = *(float *)(uVar17 + 0xc0 + lVar24);
                fVar29 = *(float *)(uVar17 + 0xe0 + lVar24);
                fVar46 = *(float *)(uVar17 + 0x80 + lVar24);
                fVar47 = ((fVar58 * fVar122 + fVar61) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar116 = ((fVar58 * fVar62 + fVar61) - (float)tray.org.field_0._4_4_) *
                          (float)tray.rdir.field_0._4_4_;
                fVar120 = ((fVar58 * fVar65 + fVar61) - (float)tray.org.field_0._8_4_) *
                          (float)tray.rdir.field_0._8_4_;
                fVar58 = ((fVar58 * fVar68 + fVar61) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar70 = ((fVar72 * fVar122 + fVar67) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar73 = ((fVar72 * fVar62 + fVar67) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar75 = ((fVar72 * fVar65 + fVar67) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar72 = ((fVar72 * fVar68 + fVar67) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar78 = ((fVar74 * fVar122 + fVar76) - (float)tray.org.field_0._32_4_) *
                         tray.rdir.field_0._32_4_;
                fVar79 = ((fVar74 * fVar62 + fVar76) - (float)tray.org.field_0._36_4_) *
                         tray.rdir.field_0._36_4_;
                fVar80 = ((fVar74 * fVar65 + fVar76) - (float)tray.org.field_0._40_4_) *
                         tray.rdir.field_0._40_4_;
                fVar74 = ((fVar74 * fVar68 + fVar76) - (float)tray.org.field_0._44_4_) *
                         tray.rdir.field_0._44_4_;
                fVar76 = ((fVar84 * fVar122 + fVar64) - (float)tray.org.field_0._0_4_) *
                         (float)tray.rdir.field_0._0_4_;
                fVar82 = ((fVar84 * fVar62 + fVar64) - (float)tray.org.field_0._4_4_) *
                         (float)tray.rdir.field_0._4_4_;
                fVar83 = ((fVar84 * fVar65 + fVar64) - (float)tray.org.field_0._8_4_) *
                         (float)tray.rdir.field_0._8_4_;
                fVar84 = ((fVar84 * fVar68 + fVar64) - (float)tray.org.field_0._12_4_) *
                         (float)tray.rdir.field_0._12_4_;
                fVar85 = ((fVar28 * fVar122 + fVar69) - (float)tray.org.field_0._16_4_) *
                         (float)tray.rdir.field_0._16_4_;
                fVar87 = ((fVar28 * fVar62 + fVar69) - (float)tray.org.field_0._20_4_) *
                         (float)tray.rdir.field_0._20_4_;
                fVar88 = ((fVar28 * fVar65 + fVar69) - (float)tray.org.field_0._24_4_) *
                         (float)tray.rdir.field_0._24_4_;
                fVar28 = ((fVar28 * fVar68 + fVar69) - (float)tray.org.field_0._28_4_) *
                         (float)tray.rdir.field_0._28_4_;
                fVar61 = ((fVar29 * fVar122 + fVar46) - (float)tray.org.field_0._32_4_) *
                         tray.rdir.field_0._32_4_;
                fVar64 = ((fVar29 * fVar62 + fVar46) - (float)tray.org.field_0._36_4_) *
                         tray.rdir.field_0._36_4_;
                fVar67 = ((fVar29 * fVar65 + fVar46) - (float)tray.org.field_0._40_4_) *
                         tray.rdir.field_0._40_4_;
                fVar69 = ((fVar29 * fVar68 + fVar46) - (float)tray.org.field_0._44_4_) *
                         tray.rdir.field_0._44_4_;
                uVar89 = (uint)((int)fVar76 < (int)fVar47) * (int)fVar76 |
                         (uint)((int)fVar76 >= (int)fVar47) * (int)fVar47;
                uVar90 = (uint)((int)fVar82 < (int)fVar116) * (int)fVar82 |
                         (uint)((int)fVar82 >= (int)fVar116) * (int)fVar116;
                uVar91 = (uint)((int)fVar83 < (int)fVar120) * (int)fVar83 |
                         (uint)((int)fVar83 >= (int)fVar120) * (int)fVar120;
                uVar92 = (uint)((int)fVar84 < (int)fVar58) * (int)fVar84 |
                         (uint)((int)fVar84 >= (int)fVar58) * (int)fVar58;
                uVar99 = (uint)((int)fVar85 < (int)fVar70) * (int)fVar85 |
                         (uint)((int)fVar85 >= (int)fVar70) * (int)fVar70;
                uVar103 = (uint)((int)fVar87 < (int)fVar73) * (int)fVar87 |
                          (uint)((int)fVar87 >= (int)fVar73) * (int)fVar73;
                uVar105 = (uint)((int)fVar88 < (int)fVar75) * (int)fVar88 |
                          (uint)((int)fVar88 >= (int)fVar75) * (int)fVar75;
                uVar107 = (uint)((int)fVar28 < (int)fVar72) * (int)fVar28 |
                          (uint)((int)fVar28 >= (int)fVar72) * (int)fVar72;
                uVar99 = ((int)uVar99 < (int)uVar89) * uVar89 |
                         ((int)uVar99 >= (int)uVar89) * uVar99;
                uVar103 = ((int)uVar103 < (int)uVar90) * uVar90 |
                          ((int)uVar103 >= (int)uVar90) * uVar103;
                uVar105 = ((int)uVar105 < (int)uVar91) * uVar91 |
                          ((int)uVar105 >= (int)uVar91) * uVar105;
                uVar107 = ((int)uVar107 < (int)uVar92) * uVar92 |
                          ((int)uVar107 >= (int)uVar92) * uVar107;
                uVar89 = (uint)((int)fVar61 < (int)fVar78) * (int)fVar61 |
                         (uint)((int)fVar61 >= (int)fVar78) * (int)fVar78;
                uVar90 = (uint)((int)fVar64 < (int)fVar79) * (int)fVar64 |
                         (uint)((int)fVar64 >= (int)fVar79) * (int)fVar79;
                uVar91 = (uint)((int)fVar67 < (int)fVar80) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar80) * (int)fVar80;
                uVar92 = (uint)((int)fVar69 < (int)fVar74) * (int)fVar69 |
                         (uint)((int)fVar69 >= (int)fVar74) * (int)fVar74;
                fVar29 = (float)(((int)uVar89 < (int)uVar99) * uVar99 |
                                ((int)uVar89 >= (int)uVar99) * uVar89) * 0.99999964;
                fVar46 = (float)(((int)uVar90 < (int)uVar103) * uVar103 |
                                ((int)uVar90 >= (int)uVar103) * uVar90) * 0.99999964;
                fVar95 = (float)(((int)uVar91 < (int)uVar105) * uVar105 |
                                ((int)uVar91 >= (int)uVar105) * uVar91) * 0.99999964;
                fVar97 = (float)(((int)uVar92 < (int)uVar107) * uVar107 |
                                ((int)uVar92 >= (int)uVar107) * uVar92) * 0.99999964;
                uVar89 = (uint)((int)fVar76 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar76 >= (int)fVar47) * (int)fVar76;
                uVar90 = (uint)((int)fVar82 < (int)fVar116) * (int)fVar116 |
                         (uint)((int)fVar82 >= (int)fVar116) * (int)fVar82;
                uVar91 = (uint)((int)fVar83 < (int)fVar120) * (int)fVar120 |
                         (uint)((int)fVar83 >= (int)fVar120) * (int)fVar83;
                uVar92 = (uint)((int)fVar84 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar84 >= (int)fVar58) * (int)fVar84;
                uVar99 = (uint)((int)fVar85 < (int)fVar70) * (int)fVar70 |
                         (uint)((int)fVar85 >= (int)fVar70) * (int)fVar85;
                uVar103 = (uint)((int)fVar87 < (int)fVar73) * (int)fVar73 |
                          (uint)((int)fVar87 >= (int)fVar73) * (int)fVar87;
                uVar105 = (uint)((int)fVar88 < (int)fVar75) * (int)fVar75 |
                          (uint)((int)fVar88 >= (int)fVar75) * (int)fVar88;
                uVar107 = (uint)((int)fVar28 < (int)fVar72) * (int)fVar72 |
                          (uint)((int)fVar28 >= (int)fVar72) * (int)fVar28;
                uVar99 = ((int)uVar89 < (int)uVar99) * uVar89 |
                         ((int)uVar89 >= (int)uVar99) * uVar99;
                uVar103 = ((int)uVar90 < (int)uVar103) * uVar90 |
                          ((int)uVar90 >= (int)uVar103) * uVar103;
                uVar105 = ((int)uVar91 < (int)uVar105) * uVar91 |
                          ((int)uVar91 >= (int)uVar105) * uVar105;
                uVar107 = ((int)uVar92 < (int)uVar107) * uVar92 |
                          ((int)uVar92 >= (int)uVar107) * uVar107;
                uVar89 = (uint)((int)fVar61 < (int)fVar78) * (int)fVar78 |
                         (uint)((int)fVar61 >= (int)fVar78) * (int)fVar61;
                uVar90 = (uint)((int)fVar64 < (int)fVar79) * (int)fVar79 |
                         (uint)((int)fVar64 >= (int)fVar79) * (int)fVar64;
                uVar91 = (uint)((int)fVar67 < (int)fVar80) * (int)fVar80 |
                         (uint)((int)fVar67 >= (int)fVar80) * (int)fVar67;
                uVar92 = (uint)((int)fVar69 < (int)fVar74) * (int)fVar74 |
                         (uint)((int)fVar69 >= (int)fVar74) * (int)fVar69;
                fVar58 = (float)(((int)uVar99 < (int)uVar89) * uVar99 |
                                ((int)uVar99 >= (int)uVar89) * uVar89) * 1.0000004;
                fVar61 = (float)(((int)uVar103 < (int)uVar90) * uVar103 |
                                ((int)uVar103 >= (int)uVar90) * uVar90) * 1.0000004;
                fVar64 = (float)(((int)uVar105 < (int)uVar91) * uVar105 |
                                ((int)uVar105 >= (int)uVar91) * uVar91) * 1.0000004;
                fVar67 = (float)(((int)uVar107 < (int)uVar92) * uVar107 |
                                ((int)uVar107 >= (int)uVar92) * uVar92) * 1.0000004;
                bVar13 = (float)((uint)(tray.tnear.field_0.i[0] < (int)fVar29) * (int)fVar29 |
                                (uint)(tray.tnear.field_0.i[0] >= (int)fVar29) *
                                tray.tnear.field_0.i[0]) <=
                         (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar58) *
                                 tray.tfar.field_0.i[0] |
                                (uint)(tray.tfar.field_0.i[0] >= (int)fVar58) * (int)fVar58);
                uVar89 = -(uint)bVar13;
                bVar3 = (float)((uint)(tray.tnear.field_0.i[1] < (int)fVar46) * (int)fVar46 |
                               (uint)(tray.tnear.field_0.i[1] >= (int)fVar46) *
                               tray.tnear.field_0.i[1]) <=
                        (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar61) *
                                tray.tfar.field_0.i[1] |
                               (uint)(tray.tfar.field_0.i[1] >= (int)fVar61) * (int)fVar61);
                uVar90 = -(uint)bVar3;
                bVar4 = (float)((uint)(tray.tnear.field_0.i[2] < (int)fVar95) * (int)fVar95 |
                               (uint)(tray.tnear.field_0.i[2] >= (int)fVar95) *
                               tray.tnear.field_0.i[2]) <=
                        (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar64) *
                                tray.tfar.field_0.i[2] |
                               (uint)(tray.tfar.field_0.i[2] >= (int)fVar64) * (int)fVar64);
                uVar91 = -(uint)bVar4;
                bVar5 = (float)((uint)(tray.tnear.field_0.i[3] < (int)fVar97) * (int)fVar97 |
                               (uint)(tray.tnear.field_0.i[3] >= (int)fVar97) *
                               tray.tnear.field_0.i[3]) <=
                        (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar67) *
                                tray.tfar.field_0.i[3] |
                               (uint)(tray.tfar.field_0.i[3] >= (int)fVar67) * (int)fVar67);
                uVar92 = -(uint)bVar5;
                if (uVar20 == 6) {
                  fVar58 = *(float *)(uVar17 + 0xf0 + lVar24);
                  fVar61 = *(float *)(uVar17 + 0x100 + lVar24);
                  uVar89 = -(uint)((fVar122 < fVar61 && fVar58 <= fVar122) && bVar13);
                  uVar90 = -(uint)((fVar62 < fVar61 && fVar58 <= fVar62) && bVar3);
                  uVar91 = -(uint)((fVar65 < fVar61 && fVar58 <= fVar65) && bVar4);
                  uVar92 = -(uint)((fVar68 < fVar61 && fVar58 <= fVar68) && bVar5);
                }
              }
              else {
                fVar58 = *(float *)(uVar17 + 0x30 + lVar24);
                fVar61 = *(float *)(uVar17 + 0x60 + lVar24);
                fVar64 = *(float *)(uVar17 + 0x70 + lVar24);
                fVar67 = *(float *)(uVar17 + 0x90 + lVar24);
                fVar69 = *(float *)(uVar17 + 0xa0 + lVar24);
                fVar72 = *(float *)(uVar17 + 0xf0 + lVar24);
                fVar74 = *(float *)(uVar17 + 0x100 + lVar24);
                fVar76 = *(float *)(uVar17 + 0x110 + lVar24);
                fVar84 = *(float *)(uVar17 + 0x120 + lVar24);
                fVar28 = *(float *)(uVar17 + 0x130 + lVar24);
                fVar29 = *(float *)(uVar17 + 0x140 + lVar24);
                fVar68 = *(float *)(ray + 0x70);
                fVar70 = *(float *)(ray + 0x74);
                fVar73 = *(float *)(ray + 0x78);
                fVar75 = *(float *)(ray + 0x7c);
                fVar108 = 1.0 - fVar68;
                fVar110 = 1.0 - fVar70;
                fVar112 = 1.0 - fVar73;
                fVar114 = 1.0 - fVar75;
                fVar109 = fVar108 * 0.0;
                fVar111 = fVar110 * 0.0;
                fVar113 = fVar112 * 0.0;
                fVar115 = fVar114 * 0.0;
                auVar52._0_4_ =
                     fVar58 * (float)tray.dir.field_0._0_4_ +
                     fVar61 * (float)tray.dir.field_0._16_4_ +
                     fVar67 * (float)tray.dir.field_0._32_4_;
                auVar52._4_4_ =
                     fVar58 * (float)tray.dir.field_0._4_4_ +
                     fVar61 * (float)tray.dir.field_0._20_4_ +
                     fVar67 * (float)tray.dir.field_0._36_4_;
                auVar52._8_4_ =
                     fVar58 * (float)tray.dir.field_0._8_4_ +
                     fVar61 * (float)tray.dir.field_0._24_4_ +
                     fVar67 * (float)tray.dir.field_0._40_4_;
                auVar52._12_4_ =
                     fVar58 * (float)tray.dir.field_0._12_4_ +
                     fVar61 * (float)tray.dir.field_0._28_4_ +
                     fVar67 * (float)tray.dir.field_0._44_4_;
                fVar46 = *(float *)(uVar17 + 0x40 + lVar24);
                auVar128._0_4_ =
                     fVar46 * (float)tray.dir.field_0._0_4_ +
                     fVar64 * (float)tray.dir.field_0._16_4_ +
                     fVar69 * (float)tray.dir.field_0._32_4_;
                auVar128._4_4_ =
                     fVar46 * (float)tray.dir.field_0._4_4_ +
                     fVar64 * (float)tray.dir.field_0._20_4_ +
                     fVar69 * (float)tray.dir.field_0._36_4_;
                auVar128._8_4_ =
                     fVar46 * (float)tray.dir.field_0._8_4_ +
                     fVar64 * (float)tray.dir.field_0._24_4_ +
                     fVar69 * (float)tray.dir.field_0._40_4_;
                auVar128._12_4_ =
                     fVar46 * (float)tray.dir.field_0._12_4_ +
                     fVar64 * (float)tray.dir.field_0._28_4_ +
                     fVar69 * (float)tray.dir.field_0._44_4_;
                fVar122 = (float)DAT_01f4bd50;
                fVar62 = DAT_01f4bd50._4_4_;
                fVar65 = DAT_01f4bd50._8_4_;
                fVar78 = DAT_01f4bd50._12_4_;
                auVar39._4_4_ = -(uint)(ABS(auVar52._4_4_) < fVar62);
                auVar39._0_4_ = -(uint)(ABS(auVar52._0_4_) < fVar122);
                auVar39._8_4_ = -(uint)(ABS(auVar52._8_4_) < fVar65);
                auVar39._12_4_ = -(uint)(ABS(auVar52._12_4_) < fVar78);
                auVar71 = blendvps(auVar52,_DAT_01f4bd50,auVar39);
                auVar40._4_4_ = -(uint)(ABS(auVar128._4_4_) < fVar62);
                auVar40._0_4_ = -(uint)(ABS(auVar128._0_4_) < fVar122);
                auVar40._8_4_ = -(uint)(ABS(auVar128._8_4_) < fVar65);
                auVar40._12_4_ = -(uint)(ABS(auVar128._12_4_) < fVar78);
                auVar86 = blendvps(auVar128,_DAT_01f4bd50,auVar40);
                fVar47 = *(float *)(uVar17 + 0x80 + lVar24);
                fVar116 = *(float *)(uVar17 + 0xb0 + lVar24);
                fVar120 = *(float *)(uVar17 + 0x50 + lVar24);
                auVar60._0_4_ =
                     (float)tray.dir.field_0._0_4_ * fVar120 +
                     (float)tray.dir.field_0._16_4_ * fVar47 +
                     (float)tray.dir.field_0._32_4_ * fVar116;
                auVar60._4_4_ =
                     (float)tray.dir.field_0._4_4_ * fVar120 +
                     (float)tray.dir.field_0._20_4_ * fVar47 +
                     (float)tray.dir.field_0._36_4_ * fVar116;
                auVar60._8_4_ =
                     (float)tray.dir.field_0._8_4_ * fVar120 +
                     (float)tray.dir.field_0._24_4_ * fVar47 +
                     (float)tray.dir.field_0._40_4_ * fVar116;
                auVar60._12_4_ =
                     (float)tray.dir.field_0._12_4_ * fVar120 +
                     (float)tray.dir.field_0._28_4_ * fVar47 +
                     (float)tray.dir.field_0._44_4_ * fVar116;
                auVar41._4_4_ = -(uint)(ABS(auVar60._4_4_) < fVar62);
                auVar41._0_4_ = -(uint)(ABS(auVar60._0_4_) < fVar122);
                auVar41._8_4_ = -(uint)(ABS(auVar60._8_4_) < fVar65);
                auVar41._12_4_ = -(uint)(ABS(auVar60._12_4_) < fVar78);
                auVar101 = blendvps(auVar60,_DAT_01f4bd50,auVar41);
                auVar81 = rcpps(auVar41,auVar71);
                fVar78 = auVar81._0_4_;
                auVar53._0_4_ = auVar71._0_4_ * fVar78;
                fVar82 = auVar81._4_4_;
                auVar53._4_4_ = auVar71._4_4_ * fVar82;
                fVar87 = auVar81._8_4_;
                auVar53._8_4_ = auVar71._8_4_ * fVar87;
                fVar97 = auVar81._12_4_;
                auVar53._12_4_ = auVar71._12_4_ * fVar97;
                fVar78 = (1.0 - auVar53._0_4_) * fVar78 + fVar78;
                fVar82 = (1.0 - auVar53._4_4_) * fVar82 + fVar82;
                fVar87 = (1.0 - auVar53._8_4_) * fVar87 + fVar87;
                fVar97 = (1.0 - auVar53._12_4_) * fVar97 + fVar97;
                auVar81 = rcpps(auVar81,auVar86);
                fVar79 = auVar81._0_4_;
                fVar83 = auVar81._4_4_;
                fVar88 = auVar81._8_4_;
                fVar77 = auVar81._12_4_;
                fVar79 = (1.0 - auVar86._0_4_ * fVar79) * fVar79 + fVar79;
                fVar83 = (1.0 - auVar86._4_4_ * fVar83) * fVar83 + fVar83;
                fVar88 = (1.0 - auVar86._8_4_ * fVar88) * fVar88 + fVar88;
                fVar77 = (1.0 - auVar86._12_4_ * fVar77) * fVar77 + fVar77;
                auVar81 = rcpps(auVar53,auVar101);
                fVar80 = auVar81._0_4_;
                fVar85 = auVar81._4_4_;
                fVar95 = auVar81._8_4_;
                fVar48 = auVar81._12_4_;
                fVar80 = (1.0 - auVar101._0_4_ * fVar80) * fVar80 + fVar80;
                fVar85 = (1.0 - auVar101._4_4_ * fVar85) * fVar85 + fVar85;
                fVar95 = (1.0 - auVar101._8_4_ * fVar95) * fVar95 + fVar95;
                fVar48 = (1.0 - auVar101._12_4_ * fVar48) * fVar48 + fVar48;
                fVar122 = *(float *)(uVar17 + 0xc0 + lVar24);
                fVar62 = *(float *)(uVar17 + 0xd0 + lVar24);
                fVar65 = *(float *)(uVar17 + 0xe0 + lVar24);
                fVar59 = fVar58 * (float)tray.org.field_0._0_4_ +
                         fVar61 * (float)tray.org.field_0._16_4_ +
                         fVar67 * (float)tray.org.field_0._32_4_ + fVar122;
                fVar63 = fVar58 * (float)tray.org.field_0._4_4_ +
                         fVar61 * (float)tray.org.field_0._20_4_ +
                         fVar67 * (float)tray.org.field_0._36_4_ + fVar122;
                fVar66 = fVar58 * (float)tray.org.field_0._8_4_ +
                         fVar61 * (float)tray.org.field_0._24_4_ +
                         fVar67 * (float)tray.org.field_0._40_4_ + fVar122;
                fVar122 = fVar58 * (float)tray.org.field_0._12_4_ +
                          fVar61 * (float)tray.org.field_0._28_4_ +
                          fVar67 * (float)tray.org.field_0._44_4_ + fVar122;
                fVar100 = fVar46 * (float)tray.org.field_0._0_4_ +
                          fVar64 * (float)tray.org.field_0._16_4_ +
                          fVar69 * (float)tray.org.field_0._32_4_ + fVar62;
                fVar104 = fVar46 * (float)tray.org.field_0._4_4_ +
                          fVar64 * (float)tray.org.field_0._20_4_ +
                          fVar69 * (float)tray.org.field_0._36_4_ + fVar62;
                fVar106 = fVar46 * (float)tray.org.field_0._8_4_ +
                          fVar64 * (float)tray.org.field_0._24_4_ +
                          fVar69 * (float)tray.org.field_0._40_4_ + fVar62;
                fVar69 = fVar46 * (float)tray.org.field_0._12_4_ +
                         fVar64 * (float)tray.org.field_0._28_4_ +
                         fVar69 * (float)tray.org.field_0._44_4_ + fVar62;
                fVar62 = fVar120 * (float)tray.org.field_0._0_4_ +
                         fVar47 * (float)tray.org.field_0._16_4_ +
                         fVar116 * (float)tray.org.field_0._32_4_ + fVar65;
                fVar130 = fVar120 * (float)tray.org.field_0._4_4_ +
                          fVar47 * (float)tray.org.field_0._20_4_ +
                          fVar116 * (float)tray.org.field_0._36_4_ + fVar65;
                fVar131 = fVar120 * (float)tray.org.field_0._8_4_ +
                          fVar47 * (float)tray.org.field_0._24_4_ +
                          fVar116 * (float)tray.org.field_0._40_4_ + fVar65;
                fVar120 = fVar120 * (float)tray.org.field_0._12_4_ +
                          fVar47 * (float)tray.org.field_0._28_4_ +
                          fVar116 * (float)tray.org.field_0._44_4_ + fVar65;
                fVar58 = ((fVar72 * fVar68 + fVar109) - fVar59) * fVar78;
                fVar61 = ((fVar72 * fVar70 + fVar111) - fVar63) * fVar82;
                fVar64 = ((fVar72 * fVar73 + fVar113) - fVar66) * fVar87;
                fVar67 = ((fVar72 * fVar75 + fVar115) - fVar122) * fVar97;
                fVar78 = ((fVar84 * fVar68 + fVar108) - fVar59) * fVar78;
                fVar82 = ((fVar84 * fVar70 + fVar110) - fVar63) * fVar82;
                fVar87 = ((fVar84 * fVar73 + fVar112) - fVar66) * fVar87;
                fVar97 = ((fVar84 * fVar75 + fVar114) - fVar122) * fVar97;
                fVar84 = ((fVar74 * fVar68 + fVar109) - fVar100) * fVar79;
                fVar46 = ((fVar74 * fVar70 + fVar111) - fVar104) * fVar83;
                fVar47 = ((fVar74 * fVar73 + fVar113) - fVar106) * fVar88;
                fVar116 = ((fVar74 * fVar75 + fVar115) - fVar69) * fVar77;
                fVar79 = ((fVar28 * fVar68 + fVar108) - fVar100) * fVar79;
                fVar83 = ((fVar28 * fVar70 + fVar110) - fVar104) * fVar83;
                fVar88 = ((fVar28 * fVar73 + fVar112) - fVar106) * fVar88;
                fVar77 = ((fVar28 * fVar75 + fVar114) - fVar69) * fVar77;
                fVar69 = ((fVar109 + fVar76 * fVar68) - fVar62) * fVar80;
                fVar72 = ((fVar111 + fVar76 * fVar70) - fVar130) * fVar85;
                fVar74 = ((fVar113 + fVar76 * fVar73) - fVar131) * fVar95;
                fVar76 = ((fVar115 + fVar76 * fVar75) - fVar120) * fVar48;
                fVar80 = ((fVar29 * fVar68 + fVar108) - fVar62) * fVar80;
                fVar85 = ((fVar29 * fVar70 + fVar110) - fVar130) * fVar85;
                fVar95 = ((fVar29 * fVar73 + fVar112) - fVar131) * fVar95;
                fVar48 = ((fVar29 * fVar75 + fVar114) - fVar120) * fVar48;
                uVar89 = (uint)((int)fVar78 < (int)fVar58) * (int)fVar78 |
                         (uint)((int)fVar78 >= (int)fVar58) * (int)fVar58;
                uVar90 = (uint)((int)fVar82 < (int)fVar61) * (int)fVar82 |
                         (uint)((int)fVar82 >= (int)fVar61) * (int)fVar61;
                uVar91 = (uint)((int)fVar87 < (int)fVar64) * (int)fVar87 |
                         (uint)((int)fVar87 >= (int)fVar64) * (int)fVar64;
                uVar92 = (uint)((int)fVar97 < (int)fVar67) * (int)fVar97 |
                         (uint)((int)fVar97 >= (int)fVar67) * (int)fVar67;
                uVar99 = (uint)((int)fVar79 < (int)fVar84) * (int)fVar79 |
                         (uint)((int)fVar79 >= (int)fVar84) * (int)fVar84;
                uVar103 = (uint)((int)fVar83 < (int)fVar46) * (int)fVar83 |
                          (uint)((int)fVar83 >= (int)fVar46) * (int)fVar46;
                uVar105 = (uint)((int)fVar88 < (int)fVar47) * (int)fVar88 |
                          (uint)((int)fVar88 >= (int)fVar47) * (int)fVar47;
                uVar107 = (uint)((int)fVar77 < (int)fVar116) * (int)fVar77 |
                          (uint)((int)fVar77 >= (int)fVar116) * (int)fVar116;
                uVar89 = ((int)uVar99 < (int)uVar89) * uVar89 |
                         ((int)uVar99 >= (int)uVar89) * uVar99;
                uVar90 = ((int)uVar103 < (int)uVar90) * uVar90 |
                         ((int)uVar103 >= (int)uVar90) * uVar103;
                uVar91 = ((int)uVar105 < (int)uVar91) * uVar91 |
                         ((int)uVar105 >= (int)uVar91) * uVar105;
                uVar92 = ((int)uVar107 < (int)uVar92) * uVar92 |
                         ((int)uVar107 >= (int)uVar92) * uVar107;
                uVar93 = (uint)((int)fVar80 < (int)fVar69) * (int)fVar80 |
                         (uint)((int)fVar80 >= (int)fVar69) * (int)fVar69;
                uVar94 = (uint)((int)fVar85 < (int)fVar72) * (int)fVar85 |
                         (uint)((int)fVar85 >= (int)fVar72) * (int)fVar72;
                uVar96 = (uint)((int)fVar95 < (int)fVar74) * (int)fVar95 |
                         (uint)((int)fVar95 >= (int)fVar74) * (int)fVar74;
                uVar98 = (uint)((int)fVar48 < (int)fVar76) * (int)fVar48 |
                         (uint)((int)fVar48 >= (int)fVar76) * (int)fVar76;
                uVar117 = (uint)((int)fVar78 < (int)fVar58) * (int)fVar58 |
                          (uint)((int)fVar78 >= (int)fVar58) * (int)fVar78;
                uVar121 = (uint)((int)fVar82 < (int)fVar61) * (int)fVar61 |
                          (uint)((int)fVar82 >= (int)fVar61) * (int)fVar82;
                uVar123 = (uint)((int)fVar87 < (int)fVar64) * (int)fVar64 |
                          (uint)((int)fVar87 >= (int)fVar64) * (int)fVar87;
                uVar124 = (uint)((int)fVar97 < (int)fVar67) * (int)fVar67 |
                          (uint)((int)fVar97 >= (int)fVar67) * (int)fVar97;
                uVar99 = (uint)((int)fVar79 < (int)fVar84) * (int)fVar84 |
                         (uint)((int)fVar79 >= (int)fVar84) * (int)fVar79;
                uVar103 = (uint)((int)fVar83 < (int)fVar46) * (int)fVar46 |
                          (uint)((int)fVar83 >= (int)fVar46) * (int)fVar83;
                uVar105 = (uint)((int)fVar88 < (int)fVar47) * (int)fVar47 |
                          (uint)((int)fVar88 >= (int)fVar47) * (int)fVar88;
                uVar107 = (uint)((int)fVar77 < (int)fVar116) * (int)fVar116 |
                          (uint)((int)fVar77 >= (int)fVar116) * (int)fVar77;
                uVar117 = ((int)uVar117 < (int)uVar99) * uVar117 |
                          ((int)uVar117 >= (int)uVar99) * uVar99;
                uVar121 = ((int)uVar121 < (int)uVar103) * uVar121 |
                          ((int)uVar121 >= (int)uVar103) * uVar103;
                uVar123 = ((int)uVar123 < (int)uVar105) * uVar123 |
                          ((int)uVar123 >= (int)uVar105) * uVar105;
                uVar124 = ((int)uVar124 < (int)uVar107) * uVar124 |
                          ((int)uVar124 >= (int)uVar107) * uVar107;
                uVar99 = (uint)((int)fVar80 < (int)fVar69) * (int)fVar69 |
                         (uint)((int)fVar80 >= (int)fVar69) * (int)fVar80;
                uVar103 = (uint)((int)fVar85 < (int)fVar72) * (int)fVar72 |
                          (uint)((int)fVar85 >= (int)fVar72) * (int)fVar85;
                uVar105 = (uint)((int)fVar95 < (int)fVar74) * (int)fVar74 |
                          (uint)((int)fVar95 >= (int)fVar74) * (int)fVar95;
                uVar107 = (uint)((int)fVar48 < (int)fVar76) * (int)fVar76 |
                          (uint)((int)fVar48 >= (int)fVar76) * (int)fVar48;
                fVar29 = (float)(((int)uVar93 < (int)uVar89) * uVar89 |
                                ((int)uVar93 >= (int)uVar89) * uVar93) * 0.99999964;
                fVar46 = (float)(((int)uVar94 < (int)uVar90) * uVar90 |
                                ((int)uVar94 >= (int)uVar90) * uVar94) * 0.99999964;
                fVar95 = (float)(((int)uVar96 < (int)uVar91) * uVar91 |
                                ((int)uVar96 >= (int)uVar91) * uVar96) * 0.99999964;
                fVar97 = (float)(((int)uVar98 < (int)uVar92) * uVar92 |
                                ((int)uVar98 >= (int)uVar92) * uVar98) * 0.99999964;
                fVar58 = (float)(((int)uVar117 < (int)uVar99) * uVar117 |
                                ((int)uVar117 >= (int)uVar99) * uVar99) * 1.0000004;
                fVar61 = (float)(((int)uVar121 < (int)uVar103) * uVar121 |
                                ((int)uVar121 >= (int)uVar103) * uVar103) * 1.0000004;
                fVar64 = (float)(((int)uVar123 < (int)uVar105) * uVar123 |
                                ((int)uVar123 >= (int)uVar105) * uVar105) * 1.0000004;
                fVar67 = (float)(((int)uVar124 < (int)uVar107) * uVar124 |
                                ((int)uVar124 >= (int)uVar107) * uVar107) * 1.0000004;
                uVar89 = -(uint)((float)((uint)(tray.tnear.field_0.i[0] < (int)fVar29) * (int)fVar29
                                        | (uint)(tray.tnear.field_0.i[0] >= (int)fVar29) *
                                          tray.tnear.field_0.i[0]) <=
                                (float)((uint)(tray.tfar.field_0.i[0] < (int)fVar58) *
                                        tray.tfar.field_0.i[0] |
                                       (uint)(tray.tfar.field_0.i[0] >= (int)fVar58) * (int)fVar58))
                ;
                uVar90 = -(uint)((float)((uint)(tray.tnear.field_0.i[1] < (int)fVar46) * (int)fVar46
                                        | (uint)(tray.tnear.field_0.i[1] >= (int)fVar46) *
                                          tray.tnear.field_0.i[1]) <=
                                (float)((uint)(tray.tfar.field_0.i[1] < (int)fVar61) *
                                        tray.tfar.field_0.i[1] |
                                       (uint)(tray.tfar.field_0.i[1] >= (int)fVar61) * (int)fVar61))
                ;
                uVar91 = -(uint)((float)((uint)(tray.tnear.field_0.i[2] < (int)fVar95) * (int)fVar95
                                        | (uint)(tray.tnear.field_0.i[2] >= (int)fVar95) *
                                          tray.tnear.field_0.i[2]) <=
                                (float)((uint)(tray.tfar.field_0.i[2] < (int)fVar64) *
                                        tray.tfar.field_0.i[2] |
                                       (uint)(tray.tfar.field_0.i[2] >= (int)fVar64) * (int)fVar64))
                ;
                uVar92 = -(uint)((float)((uint)(tray.tnear.field_0.i[3] < (int)fVar97) * (int)fVar97
                                        | (uint)(tray.tnear.field_0.i[3] >= (int)fVar97) *
                                          tray.tnear.field_0.i[3]) <=
                                (float)((uint)(tray.tfar.field_0.i[3] < (int)fVar67) *
                                        tray.tfar.field_0.i[3] |
                                       (uint)(tray.tfar.field_0.i[3] >= (int)fVar67) * (int)fVar67))
                ;
                aVar129 = _DAT_01f45a30;
              }
              auVar42._0_4_ = (uVar89 & -(uint)(fVar49 < tray.tfar.field_0.v[0])) << 0x1f;
              auVar42._4_4_ = (uVar90 & -(uint)(fVar55 < tray.tfar.field_0.v[1])) << 0x1f;
              auVar42._8_4_ = (uVar91 & -(uint)(fVar56 < tray.tfar.field_0.v[2])) << 0x1f;
              auVar42._12_4_ = (uVar92 & -(uint)(fVar57 < tray.tfar.field_0.v[3])) << 0x1f;
              uVar89 = movmskps((int)valid_i,auVar42);
              valid_i = (vint<4> *)(ulong)uVar89;
              sVar12 = root.ptr;
              aVar54 = aVar51;
              if ((uVar89 != 0) &&
                 (auVar6._4_4_ = fVar46, auVar6._0_4_ = fVar29, auVar6._8_4_ = fVar95,
                 auVar6._12_4_ = fVar97, aVar54.v = (__m128)blendvps(aVar129.v,auVar6,auVar42),
                 sVar12 = sVar1, root.ptr != 8)) {
                pNVar26->ptr = root.ptr;
                pNVar26 = pNVar26 + 1;
                local_1958 = aVar51._0_8_;
                uStack_1950 = aVar51._8_8_;
                *(undefined8 *)paVar25 = local_1958;
                *(undefined8 *)(paVar25->v + 2) = uStack_1950;
                paVar25 = paVar25 + 1;
              }
              root.ptr = sVar12;
              aVar51 = aVar54;
            }
            if (root.ptr == 8) goto LAB_006d5009;
            auVar43._4_4_ = -(uint)(aVar51.v[1] < tray.tfar.field_0.v[1]);
            auVar43._0_4_ = -(uint)(aVar51.v[0] < tray.tfar.field_0.v[0]);
            auVar43._8_4_ = -(uint)(aVar51.v[2] < tray.tfar.field_0.v[2]);
            auVar43._12_4_ = -(uint)(aVar51.v[3] < tray.tfar.field_0.v[3]);
            uVar14 = movmskps((int)uVar17,auVar43);
            puVar15 = (undefined1 *)(ulong)(uint)POPCOUNT(uVar14);
          } while ((byte)pRVar23 < (byte)POPCOUNT(uVar14));
          pNVar26->ptr = root.ptr;
          pNVar26 = pNVar26 + 1;
          *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar25->v = aVar51;
          paVar25 = paVar25 + 1;
LAB_006d5009:
          puVar15 = &DAT_00000004;
        }
        else {
          while (uVar21 != 0) {
            k = (RayQueryContext *)0x0;
            if (uVar21 != 0) {
              for (; (uVar21 >> (long)k & 1) == 0; k = (RayQueryContext *)((long)&k->scene + 1)) {
              }
            }
            uVar21 = uVar21 & uVar21 - 1;
            pRVar22 = k;
            valid_i = (vint<4> *)This;
            bVar13 = occluded1(This,bvh,root,(size_t)k,&pre,ray,&tray,context);
            if (bVar13) {
              terminated.field_0.i[(long)k] = -1;
            }
          }
          iVar27 = movmskps((int)pRVar22,(undefined1  [16])terminated.field_0);
          puVar15 = (undefined1 *)0x3;
          if (iVar27 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            puVar15 = (undefined1 *)0x2;
          }
          uVar21 = 0;
          pRVar22 = pRVar16;
          aVar129 = _DAT_01f45a30;
          if (pRVar23 < pRVar16) goto LAB_006d49d0;
        }
      } while ((int)puVar15 != 3);
LAB_006d51cd:
      auVar45._0_4_ = auVar50._0_4_ & terminated.field_0.i[0];
      auVar45._4_4_ = auVar50._4_4_ & terminated.field_0.i[1];
      auVar45._8_4_ = auVar50._8_4_ & terminated.field_0.i[2];
      auVar45._12_4_ = auVar50._12_4_ & terminated.field_0.i[3];
      auVar81 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar45);
      *(undefined1 (*) [16])(ray + 0x80) = auVar81;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }